

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

void __thiscall testing::internal::FilePath::Normalize(FilePath *this)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __x;
  bool bVar1;
  reference pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  char character;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  iterator out;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  char in_stack_ffffffffffffff7f;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff88;
  undefined8 local_68;
  undefined8 local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined8 local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  undefined8 local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  char local_29;
  undefined8 local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20 [2];
  undefined8 local_10;
  
  local_10 = std::__cxx11::string::begin();
  local_20[0]._M_current = (char *)std::__cxx11::string::begin();
  local_28 = std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (in_RDI,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)CONCAT17(in_stack_ffffffffffffff7f,
                                               CONCAT16(in_stack_ffffffffffffff7e,
                                                        in_stack_ffffffffffffff78))), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(local_20);
    local_29 = *pcVar2;
    bVar1 = IsPathSeparator(local_29);
    if (bVar1) {
      local_40 = std::__cxx11::string::begin();
      bVar1 = __gnu_cxx::operator==
                        (in_RDI,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)CONCAT17(in_stack_ffffffffffffff7f,
                                            CONCAT16(in_stack_ffffffffffffff7e,
                                                     in_stack_ffffffffffffff78)));
      in_stack_ffffffffffffff7e = true;
      if (!bVar1) {
        local_50 = local_10;
        __x._M_current._6_1_ = 1;
        __x._M_current._0_6_ = in_stack_ffffffffffffff78;
        __x._M_current._7_1_ = in_stack_ffffffffffffff7f;
        local_48 = std::prev<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(__x,0x139429)
        ;
        pcVar2 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_48);
        in_stack_ffffffffffffff7e = *pcVar2 != '/';
      }
      if ((bool)in_stack_ffffffffffffff7e != false) {
        local_58 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator++(in_stack_ffffffffffffff88,(int)((ulong)in_RDI >> 0x20));
        pcVar2 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_58);
        *pcVar2 = '/';
      }
    }
    else {
      in_stack_ffffffffffffff7f = local_29;
      local_38 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(in_stack_ffffffffffffff88,(int)((ulong)in_RDI >> 0x20));
      pcVar2 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_38);
      *pcVar2 = in_stack_ffffffffffffff7f;
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_20);
  }
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffff7f,
                         CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
  std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffff7f,
                         CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
  std::__cxx11::string::erase(in_RDI,local_60,local_68);
  return;
}

Assistant:

void FilePath::Normalize() {
  auto out = pathname_.begin();

  for (const char character : pathname_) {
    if (!IsPathSeparator(character)) {
      *(out++) = character;
    } else if (out == pathname_.begin() || *std::prev(out) != kPathSeparator) {
      *(out++) = kPathSeparator;
    } else {
      continue;
    }
  }

  pathname_.erase(out, pathname_.end());
}